

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O0

string<unsigned_long> __thiscall
irr::core::string<unsigned_long>::subString(string<unsigned_long> *this,s32 begin,s32 length)

{
  int in_ECX;
  long extraout_RDX;
  long lVar1;
  undefined4 in_register_00000034;
  string<unsigned_long> sVar2;
  int local_38;
  s32 i;
  s32 length_local;
  s32 begin_local;
  string<unsigned_long> *this_local;
  string<unsigned_long> *o;
  
  if (in_ECX < 1) {
    string<char>(this,"");
    lVar1 = extraout_RDX;
  }
  else {
    string(this);
    reserve(this,in_ECX + 1);
    for (local_38 = 0; local_38 < in_ECX; local_38 = local_38 + 1) {
      this->array[local_38] =
           *(unsigned_long *)
            (*(long *)CONCAT44(in_register_00000034,begin) + (long)(local_38 + length) * 8);
    }
    lVar1 = (long)in_ECX;
    this->array[lVar1] = 0;
    this->used = this->allocated;
  }
  sVar2.allocated = (int)lVar1;
  sVar2.used = (int)((ulong)lVar1 >> 0x20);
  sVar2.array = (unsigned_long *)this;
  return sVar2;
}

Assistant:

string<T> subString(s32 begin, s32 length)
	{
		if (length <= 0)
			return string<T>("");

		string<T> o;
		o.reserve(length+1);

		for (s32 i=0; i<length; ++i)
			o.array[i] = array[i+begin];

		o.array[length] = 0;
		o.used = o.allocated;

		return o;
	}